

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O0

void mat_postmult_diag(csc *A,c_float *d)

{
  c_int i;
  c_int j;
  c_float *d_local;
  csc *A_local;
  
  for (j = 0; j < A->n; j = j + 1) {
    for (i = A->p[j]; i < A->p[j + 1]; i = i + 1) {
      A->x[i] = d[j] * A->x[i];
    }
  }
  return;
}

Assistant:

void mat_postmult_diag(csc *A, const c_float *d) {
  c_int j, i;

  for (j = 0; j < A->n; j++) {                // Cycle over columns j
    for (i = A->p[j]; i < A->p[j + 1]; i++) { // Cycle every row i in column j
      A->x[i] *= d[j];                        // Scale by corresponding element
                                              // of d for column j
    }
  }
}